

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_0::AsyncifyLocals::doWalkFunction(AsyncifyLocals *this,Function *func)

{
  Name name;
  Return *right;
  Function *pFVar1;
  bool bVar2;
  Index IVar3;
  Module *pMVar4;
  pointer pAVar5;
  pointer pAVar6;
  pointer pAVar7;
  Expression *pEVar8;
  Expression *ifTrue;
  pointer this_00;
  Block *pBVar9;
  ExpressionList *this_01;
  optional<wasm::Type> type_;
  optional<wasm::Type> type;
  optional<wasm::Type> type_00;
  optional<wasm::Type> type_01;
  ReFinalize local_278;
  Type local_110;
  optional<wasm::Type> local_108;
  Type local_f8;
  BasicType local_ec;
  Type local_e8 [2];
  optional<wasm::Type> local_d8;
  optional<wasm::Type> local_c0;
  size_t local_b0;
  char *local_a8;
  optional<wasm::Type> local_98;
  If *local_88;
  LocalSet *local_80;
  Expression *local_78;
  Expression *local_70;
  initializer_list<wasm::Expression_*> local_68;
  Block *local_58;
  Block *newBody;
  Type local_48;
  Return *local_40;
  Expression *barrier;
  Type local_30;
  Type local_28;
  Index local_1c;
  Function *pFStack_18;
  Index unwindIndex;
  Function *func_local;
  AsyncifyLocals *this_local;
  
  pFStack_18 = func;
  func_local = (Function *)this;
  bVar2 = anon_unknown_0::ModuleAnalyzer::needsInstrumentation(this->analyzer,func);
  if (bVar2) {
    findRelevantLiveLocals(this,pFStack_18);
    std::
    unique_ptr<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
    ::operator->(&this->builder);
    pFVar1 = pFStack_18;
    wasm::Type::Type(&local_28,i32);
    local_1c = Builder::addVar(pFVar1,local_28);
    std::
    unique_ptr<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
    ::operator->(&this->builder);
    pFVar1 = pFStack_18;
    wasm::Type::Type(&local_30,i32);
    IVar3 = Builder::addVar(pFVar1,local_30);
    this->rewindIndex = IVar3;
    pMVar4 = Walker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>
             ::getModule(&(this->
                          super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>_>
                          ).
                          super_PostWalker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>
                          .
                          super_Walker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>
                        );
    std::
    make_unique<wasm::(anonymous_namespace)::AsyncifyBuilder,wasm::Module&,wasm::Type&,wasm::Name&>
              ((Module *)&barrier,(Type *)pMVar4,(Name *)&this->pointerType);
    std::
    unique_ptr<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
    ::operator=(&this->builder,
                (unique_ptr<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                 *)&barrier);
    std::
    unique_ptr<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
    ::~unique_ptr((unique_ptr<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                   *)&barrier);
    Walker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>
    ::walk(&(this->
            super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>_>
            ).
            super_PostWalker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>
            .
            super_Walker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>
           ,&pFStack_18->body);
    local_48 = Function::getResults(pFStack_18);
    newBody._4_4_ = 0;
    bVar2 = wasm::Type::operator==(&local_48,(BasicType *)((long)&newBody + 4));
    if (bVar2) {
      pAVar5 = std::
               unique_ptr<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
               ::operator->(&this->builder);
      local_40 = Builder::makeReturn(&pAVar5->super_Builder,(Expression *)0x0);
    }
    else {
      pAVar5 = std::
               unique_ptr<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
               ::operator->(&this->builder);
      local_40 = (Return *)Builder::makeUnreachable(&pAVar5->super_Builder);
    }
    pAVar5 = std::
             unique_ptr<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
             ::operator->(&this->builder);
    pAVar6 = std::
             unique_ptr<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
             ::operator->(&this->builder);
    pAVar7 = std::
             unique_ptr<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
             ::operator->(&this->builder);
    pEVar8 = AsyncifyBuilder::makeStateCheck(pAVar7,Rewinding);
    ifTrue = makeLocalLoading(this);
    std::optional<wasm::Type>::optional(&local_98);
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._9_7_ = 0;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload =
         local_98.super__Optional_base<wasm::Type,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Type>._M_payload;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_engaged =
         local_98.super__Optional_base<wasm::Type,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Type>._M_engaged;
    local_88 = Builder::makeIf(&pAVar6->super_Builder,pEVar8,ifTrue,(Expression *)0x0,type);
    pAVar6 = std::
             unique_ptr<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
             ::operator->(&this->builder);
    IVar3 = local_1c;
    pAVar7 = std::
             unique_ptr<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
             ::operator->(&this->builder);
    local_b0 = wasm::(anonymous_namespace)::ASYNCIFY_UNWIND;
    local_a8 = DAT_03193648;
    this_00 = std::
              unique_ptr<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
              ::operator->(&this->builder);
    right = local_40;
    pEVar8 = pFStack_18->body;
    std::optional<wasm::Type>::optional(&local_c0);
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._9_7_ = 0;
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload =
         local_c0.super__Optional_base<wasm::Type,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Type>._M_payload;
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_engaged =
         local_c0.super__Optional_base<wasm::Type,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Type>._M_engaged;
    pBVar9 = Builder::makeSequence(&this_00->super_Builder,pEVar8,(Expression *)right,type_00);
    name.super_IString.str._M_str = local_a8;
    name.super_IString.str._M_len = local_b0;
    pBVar9 = Builder::makeBlock(&pAVar7->super_Builder,name,(Expression *)pBVar9);
    local_80 = Builder::makeLocalSet(&pAVar6->super_Builder,IVar3,(Expression *)pBVar9);
    local_78 = makeCallIndexPush(this,local_1c);
    local_70 = makeLocalSaving(this);
    local_68._M_array = (iterator)&local_88;
    local_68._M_len = 4;
    std::optional<wasm::Type>::optional(&local_d8);
    type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._9_7_ = 0;
    type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload =
         local_d8.super__Optional_base<wasm::Type,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Type>._M_payload;
    type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_engaged =
         local_d8.super__Optional_base<wasm::Type,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Type>._M_engaged;
    local_58 = Builder::makeBlock(&pAVar5->super_Builder,&local_68,type_01);
    local_e8[0] = Function::getResults(pFStack_18);
    local_ec = none;
    bVar2 = wasm::Type::operator!=(local_e8,&local_ec);
    if (bVar2) {
      this_01 = &local_58->list;
      local_f8 = Function::getResults(pFStack_18);
      pMVar4 = Walker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>
               ::getModule(&(this->
                            super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>_>
                            ).
                            super_PostWalker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>
                            .
                            super_Walker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>
                          );
      pEVar8 = LiteralUtils::makeZero(local_f8,pMVar4);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&this_01->
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,pEVar8)
      ;
      pBVar9 = local_58;
      local_110 = Function::getResults(pFStack_18);
      std::optional<wasm::Type>::optional<wasm::Type,_true>(&local_108,&local_110);
      type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._9_7_ = 0;
      type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload =
           local_108.super__Optional_base<wasm::Type,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::Type>._M_payload;
      type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_engaged =
           local_108.super__Optional_base<wasm::Type,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::Type>._M_engaged;
      Block::finalize(pBVar9,type_,Unknown);
    }
    pFStack_18->body = (Expression *)local_58;
    ReFinalize::ReFinalize(&local_278);
    pFVar1 = pFStack_18;
    pMVar4 = Walker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>
             ::getModule(&(this->
                          super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>_>
                          ).
                          super_PostWalker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>
                          .
                          super_Walker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>
                        );
    Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::walkFunctionInModule
              (&local_278.
                super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                .
                super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>
                .super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>,
               pFVar1,pMVar4);
    ReFinalize::~ReFinalize(&local_278);
  }
  return;
}

Assistant:

void doWalkFunction(Function* func) {
    // If the function cannot change our state, we have nothing to do -
    // we will never unwind or rewind the stack here.
    if (!analyzer->needsInstrumentation(func)) {
      return;
    }
    // Find the locals that we actually need to load and save: any local that is
    // alive at a relevant call site must be handled, but others can be ignored.
    findRelevantLiveLocals(func);
    // The new function body has a prelude to load locals if rewinding,
    // then the actual main body, which does all its unwindings by breaking
    // to the unwind block, which then handles pushing the call index, as
    // well as saving the locals.
    // An index is needed for getting the unwinding and rewinding call indexes
    // around TODO: can this be the same index?
    auto unwindIndex = builder->addVar(func, Type::i32);
    rewindIndex = builder->addVar(func, Type::i32);
    // Rewrite the function body.
    builder = std::make_unique<AsyncifyBuilder>(
      *getModule(), pointerType, asyncifyMemory);
    walk(func->body);
    // After the normal function body, emit a barrier before the postamble.
    Expression* barrier;
    if (func->getResults() == Type::none) {
      // The function may have ended without a return; ensure one.
      barrier = builder->makeReturn();
    } else {
      // The function must have returned or hit an unreachable, but emit one
      // to make possible bugs easier to figure out (as this should never be
      // reached). The optimizer can remove this anyhow.
      barrier = builder->makeUnreachable();
    }
    auto* newBody = builder->makeBlock(
      {builder->makeIf(builder->makeStateCheck(State::Rewinding),
                       makeLocalLoading()),
       builder->makeLocalSet(
         unwindIndex,
         builder->makeBlock(ASYNCIFY_UNWIND,
                            builder->makeSequence(func->body, barrier))),
       makeCallIndexPush(unwindIndex),
       makeLocalSaving()});
    if (func->getResults() != Type::none) {
      // If we unwind, we must still "return" a value, even if it will be
      // ignored on the outside.
      newBody->list.push_back(
        LiteralUtils::makeZero(func->getResults(), *getModule()));
      newBody->finalize(func->getResults());
    }
    func->body = newBody;
    // Making things like returns conditional may alter types.
    ReFinalize().walkFunctionInModule(func, getModule());
  }